

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void minMaxValueFinalize(sqlite3_context *context,int bValue)

{
  Mem *pFrom;
  
  if ((context->pMem->flags & 0x2000) == 0) {
    pFrom = (Mem *)createAggContext(context,0);
  }
  else {
    pFrom = (Mem *)context->pMem->z;
  }
  if (pFrom != (Mem *)0x0) {
    if (pFrom->flags != 0) {
      sqlite3VdbeMemCopy(context->pOut,pFrom);
    }
    if ((bValue == 0) && (((pFrom->flags & 0x2400) != 0 || (pFrom->szMalloc != 0)))) {
      vdbeMemClear(pFrom);
      return;
    }
  }
  return;
}

Assistant:

static void minMaxValueFinalize(sqlite3_context *context, int bValue){
  sqlite3_value *pRes;
  pRes = (sqlite3_value *)sqlite3_aggregate_context(context, 0);
  if( pRes ){
    if( pRes->flags ){
      sqlite3_result_value(context, pRes);
    }
    if( bValue==0 ) sqlite3VdbeMemRelease(pRes);
  }
}